

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O0

void __thiscall FPTest_GetCachedPower_Test::TestBody(FPTest_GetCachedPower_Test *this)

{
  bool bVar1;
  fp fVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  int dec_exp_step;
  AssertionResult gtest_ar;
  fp fp;
  int dec_exp;
  int exp;
  double in_stack_000002b0;
  double in_stack_000002b8;
  char *in_stack_000002c0;
  char *in_stack_000002c8;
  char *in_stack_fffffffffffffee8;
  AssertHelper *in_stack_fffffffffffffef0;
  AssertionResult *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  Type type;
  AssertHelper *in_stack_ffffffffffffff20;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff68;
  AssertHelper *in_stack_ffffffffffffff70;
  AssertionResult local_78;
  undefined4 local_64;
  double *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  AssertionResult local_40;
  significand_type local_30;
  int local_28;
  significand_type local_20;
  int local_18 [2];
  undefined4 local_10;
  int local_c;
  
  for (local_c = -0x3fd; type = (Type)((ulong)in_stack_ffffffffffffff18 >> 0x20), local_c < 0x401;
      local_c = local_c + 1) {
    local_10 = 0;
    fVar2 = fmt::v5::internal::get_cached_power
                      (in_stack_ffffffffffffff04,(int *)in_stack_fffffffffffffef8);
    local_30 = fVar2.f;
    local_28 = fVar2.e;
    local_20 = local_30;
    local_18[0] = local_28;
    testing::internal::CmpHelperLE<int,int>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (int *)in_stack_ffffffffffffffa0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff20);
      testing::AssertionResult::failure_message((AssertionResult *)0x11021b);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff20,type,in_stack_ffffffffffffff10,
                 (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff70,(Message *)in_stack_ffffffffffffff68.ptr_);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffef0);
      testing::Message::~Message((Message *)0x110278);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1102d0);
    local_64 = 8;
    in_stack_ffffffffffffff18 = local_18;
    in_stack_ffffffffffffff10 = (char *)(double)local_c;
    in_stack_ffffffffffffff20 = (AssertHelper *)0x4020000000000000;
    std::log2<int>(0);
    testing::internal::CmpHelperLE<int,double>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff20);
      in_stack_ffffffffffffff08 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1103c3);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff20,(Type)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff70,(Message *)in_stack_ffffffffffffff68.ptr_);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffef0);
      testing::Message::~Message((Message *)0x110420);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x110475);
    in_stack_fffffffffffffef0 = (AssertHelper *)std::pow<int,int>(0,0x110486);
    std::ldexp<unsigned_long>
              ((unsigned_long)in_stack_fffffffffffffef0,
               (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    in_stack_fffffffffffffef8 = (AssertionResult *)&stack0xffffffffffffff60;
    testing::internal::CmpHelperFloatingPointEQ<double>
              (in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,in_stack_000002b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffef8);
    in_stack_ffffffffffffff04 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff04);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff20);
      in_stack_fffffffffffffee8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x110526);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff20,(Type)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff70,(Message *)in_stack_ffffffffffffff68.ptr_);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffef0);
      testing::Message::~Message((Message *)0x110572);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1105be);
  }
  return;
}

Assistant:

TEST(FPTest, GetCachedPower) {
  typedef std::numeric_limits<double> limits;
  for (auto exp = limits::min_exponent; exp <= limits::max_exponent; ++exp) {
    int dec_exp = 0;
    auto fp = fmt::internal::get_cached_power(exp, dec_exp);
    EXPECT_LE(exp, fp.e);
    int dec_exp_step = 8;
    EXPECT_LE(fp.e, exp + dec_exp_step * log2(10));
    EXPECT_DOUBLE_EQ(pow(10, dec_exp), ldexp(fp.f, fp.e));
  }
}